

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O1

void __thiscall
duckdb::ParquetWriter::SetWrittenStatistics
          (ParquetWriter *this,CopyFunctionFileStatistics *written_stats_p)

{
  pointer puVar1;
  ParquetColumnSchema *schema;
  pointer __p;
  pointer pCVar2;
  pointer unifiers;
  pointer this_00;
  string local_50;
  
  (this->written_stats).ptr = written_stats_p;
  __p = (pointer)operator_new(0x18);
  (__p->stats_unifiers).
  super_vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->stats_unifiers).
  super_vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->stats_unifiers).
  super_vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
  ::reset((__uniq_ptr_impl<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>_>
           *)&this->stats_accumulator,__p);
  this_00 = (this->column_writers).
            super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->column_writers).
           super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != puVar1) {
    do {
      pCVar2 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
               operator->(this_00);
      schema = pCVar2->column_schema;
      unifiers = unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
                 ::operator->(&this->stats_accumulator);
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      GetStatsUnifier(schema,&unifiers->stats_unifiers,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar1);
  }
  return;
}

Assistant:

void ParquetWriter::SetWrittenStatistics(CopyFunctionFileStatistics &written_stats_p) {
	written_stats = written_stats_p;
	stats_accumulator = make_uniq<ParquetStatsAccumulator>();
	// create the per-column stats unifiers
	for (auto &column_writer : column_writers) {
		GetStatsUnifier(column_writer->Schema(), stats_accumulator->stats_unifiers);
	}
}